

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeMinMaxValues
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *side,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minRes,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxRes,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *minVal,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *maxVal)

{
  Real RVar1;
  bool bVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  shared_ptr<soplex::Tolerances> *psVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  uint local_188 [5];
  undefined3 uStack_173;
  int local_170;
  bool local_16c;
  undefined8 local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&minVal->m_backend,0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&maxVal->m_backend,0);
  local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_118.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_118.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_118.m_backend.exp = (val->m_backend).exp;
  local_118.m_backend.neg = (val->m_backend).neg;
  local_118.m_backend.fpclass = (val->m_backend).fpclass;
  local_118.m_backend.prec_elem = (val->m_backend).prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,0.0,(type *)0x0);
  psVar5 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_198,
             &psVar5->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar1 = Tolerances::epsilon((Tolerances *)local_198);
  bVar2 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_118,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,RVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_190);
  if (bVar2) {
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)local_198,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (minRes,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_198);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_198,-*pdVar4,(type *)0x0);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(uStack_173,stack0xfffffffffffffe88);
      (minVal->m_backend).data._M_elems[4] = local_188[0];
      (minVal->m_backend).data._M_elems[5] = local_188[1];
      (minVal->m_backend).data._M_elems[6] = local_188[2];
      (minVal->m_backend).data._M_elems[7] = local_188[3];
      *(undefined1 (*) [8])(minVal->m_backend).data._M_elems = local_198;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((minVal->m_backend).data._M_elems + 2) =
           _Stack_190._M_pi;
      fVar6 = (fpclass_type)local_168;
      iVar7 = SUB84(local_168,4);
    }
    else {
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_d8,&side->m_backend,&minRes->m_backend);
      local_168._0_4_ = cpp_dec_float_finite;
      local_168._4_4_ = 10;
      local_198 = (undefined1  [8])0x0;
      _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_188[0] = 0;
      local_188[1] = 0;
      local_188[2] = 0;
      local_188[3] = 0;
      stack0xfffffffffffffe88 = 0;
      uStack_173 = 0;
      local_170 = 0;
      local_16c = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)local_198,&local_d8,&val->m_backend);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(uStack_173,stack0xfffffffffffffe88);
      (minVal->m_backend).data._M_elems[4] = local_188[0];
      (minVal->m_backend).data._M_elems[5] = local_188[1];
      (minVal->m_backend).data._M_elems[6] = local_188[2];
      (minVal->m_backend).data._M_elems[7] = local_188[3];
      *(undefined1 (*) [8])(minVal->m_backend).data._M_elems = local_198;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((minVal->m_backend).data._M_elems + 2) =
           _Stack_190._M_pi;
      fVar6 = (fpclass_type)local_168;
      iVar7 = SUB84(local_168,4);
    }
    (minVal->m_backend).exp = local_170;
    (minVal->m_backend).neg = local_16c;
    (minVal->m_backend).fpclass = fVar6;
    (minVal->m_backend).prec_elem = iVar7;
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)local_198,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>=
                      (maxRes,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_198);
    minRes = maxRes;
    if (tVar3) {
LAB_002830dc:
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_198,*pdVar4,(type *)0x0);
      *(ulong *)((maxVal->m_backend).data._M_elems + 8) =
           CONCAT35(uStack_173,stack0xfffffffffffffe88);
      *(undefined8 *)((maxVal->m_backend).data._M_elems + 4) = local_188._0_8_;
      *(ulong *)((maxVal->m_backend).data._M_elems + 6) = CONCAT44(local_188[3],local_188[2]);
      *(undefined1 (*) [8])(maxVal->m_backend).data._M_elems = local_198;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((maxVal->m_backend).data._M_elems + 2) =
           _Stack_190._M_pi;
      (maxVal->m_backend).exp = local_170;
      (maxVal->m_backend).neg = local_16c;
      goto LAB_002831af;
    }
  }
  else {
    local_158.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_158.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_158.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_158.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    local_158.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_158.m_backend.exp = (val->m_backend).exp;
    local_158.m_backend.neg = (val->m_backend).neg;
    local_158.m_backend.fpclass = (val->m_backend).fpclass;
    local_158.m_backend.prec_elem = (val->m_backend).prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,0.0,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_198,
               &psVar5->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon((Tolerances *)local_198);
    bVar2 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_158,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a0,RVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_190);
    if (!bVar2) {
      return;
    }
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)local_198,*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator>=
                      (maxRes,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_198);
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_198,-*pdVar4,(type *)0x0);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(uStack_173,stack0xfffffffffffffe88);
      (minVal->m_backend).data._M_elems[4] = local_188[0];
      (minVal->m_backend).data._M_elems[5] = local_188[1];
      (minVal->m_backend).data._M_elems[6] = local_188[2];
      (minVal->m_backend).data._M_elems[7] = local_188[3];
      *(undefined1 (*) [8])(minVal->m_backend).data._M_elems = local_198;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((minVal->m_backend).data._M_elems + 2) =
           _Stack_190._M_pi;
      fVar6 = (fpclass_type)local_168;
      iVar7 = SUB84(local_168,4);
    }
    else {
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_d8,&side->m_backend,&maxRes->m_backend);
      local_168._0_4_ = cpp_dec_float_finite;
      local_168._4_4_ = 10;
      local_198 = (undefined1  [8])0x0;
      _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_188[0] = 0;
      local_188[1] = 0;
      local_188[2] = 0;
      local_188[3] = 0;
      stack0xfffffffffffffe88 = 0;
      uStack_173 = 0;
      local_170 = 0;
      local_16c = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)local_198,&local_d8,&val->m_backend);
      *(ulong *)((minVal->m_backend).data._M_elems + 8) =
           CONCAT35(uStack_173,stack0xfffffffffffffe88);
      (minVal->m_backend).data._M_elems[4] = local_188[0];
      (minVal->m_backend).data._M_elems[5] = local_188[1];
      (minVal->m_backend).data._M_elems[6] = local_188[2];
      (minVal->m_backend).data._M_elems[7] = local_188[3];
      *(undefined1 (*) [8])(minVal->m_backend).data._M_elems = local_198;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((minVal->m_backend).data._M_elems + 2) =
           _Stack_190._M_pi;
      fVar6 = (fpclass_type)local_168;
      iVar7 = SUB84(local_168,4);
    }
    (minVal->m_backend).exp = local_170;
    (minVal->m_backend).neg = local_16c;
    (minVal->m_backend).fpclass = fVar6;
    (minVal->m_backend).prec_elem = iVar7;
    pdVar4 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)local_198,-*pdVar4,(type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (minRes,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)local_198);
    if (tVar3) goto LAB_002830dc;
  }
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8._37_8_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d8,&side->m_backend,&minRes->m_backend);
  local_168._0_4_ = cpp_dec_float_finite;
  local_168._4_4_ = 10;
  local_198 = (undefined1  [8])0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_188[0] = 0;
  local_188[1] = 0;
  local_188[2] = 0;
  local_188[3] = 0;
  stack0xfffffffffffffe88 = 0;
  uStack_173 = 0;
  local_170 = 0;
  local_16c = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((cpp_dec_float<50U,_int,_void> *)local_198,&local_d8,&val->m_backend);
  *(ulong *)((maxVal->m_backend).data._M_elems + 8) = CONCAT35(uStack_173,stack0xfffffffffffffe88);
  *(undefined8 *)((maxVal->m_backend).data._M_elems + 4) = local_188._0_8_;
  *(ulong *)((maxVal->m_backend).data._M_elems + 6) = CONCAT44(local_188[3],local_188[2]);
  *(undefined1 (*) [8])(maxVal->m_backend).data._M_elems = local_198;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((maxVal->m_backend).data._M_elems + 2) =
       _Stack_190._M_pi;
  (maxVal->m_backend).exp = local_170;
  (maxVal->m_backend).neg = local_16c;
LAB_002831af:
  (maxVal->m_backend).fpclass = (fpclass_type)local_168;
  (maxVal->m_backend).prec_elem = SUB84(local_168,4);
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}